

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O0

void swap(List *ls,ByteSize size,BOOL sgnd)

{
  List *pLVar1;
  List *__dest;
  List *new;
  List *swap;
  BOOL sgnd_local;
  ByteSize size_local;
  List *ls_local;
  
  if (size != BS_BYTE) {
    if (size == BS_UNKNOWN) {
      parse_error(ls,"Internal error, byteorder.c: Attempting to swap with size == BS_UNKNOWN!\n");
    }
    else {
      pLVar1 = alloc_list();
      __dest = alloc_list();
      memcpy(__dest,ls,0x30);
      __dest->cdr = (ListStruct *)0x0;
      (pLVar1->token).type = TOK_SWAP;
      if (((size != BS_BYTE) && (size != BS_WORD)) && (size != BS_LONG)) {
        __assert_fail("size == 1 || size == 2 || size == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/byteorder.c"
                      ,0x137,"void swap(List *, ByteSize, BOOL)");
      }
      (pLVar1->token).u.reginfo.size = (uchar)size;
      (pLVar1->token).u.reginfo.sgnd = (uchar)sgnd;
      pLVar1->cdr = __dest;
      (ls->token).type = TOK_LIST;
      ls->car = pLVar1;
      propagate_fileinfo(&ls->token,ls);
    }
  }
  return;
}

Assistant:

static void
swap (List *ls, ByteSize size, BOOL sgnd)
{
  List *swap, *new;

  /* Pointless to swap bytes, assuming they aren't trying to use
   * swapsb or swapub as a cast!
   */
  if (size == BS_BYTE)
    return;

  /* Verify that we have a legal size. */
  if (size == BS_UNKNOWN)
    {
      parse_error (ls, "Internal error, byteorder.c: Attempting to swap with "
		   "size == BS_UNKNOWN!\n");
      return;
    }

  swap = alloc_list ();
  new = alloc_list ();

  /* Copy the specified list. */
  *new = *ls;
  new->cdr = NULL;

  /* Create swap expr. */
  swap->token.type = TOK_SWAP;

  assert (size == 1 || size == 2 || size == 4);

  swap->token.u.swapinfo.size = size;
  swap->token.u.swapinfo.sgnd = sgnd;
  swap->cdr = new;

  /* Make the specified list be a real list that contains (swap expr). */
  ls->token.type = TOK_LIST;
  ls->car = swap;

  propagate_fileinfo (&ls->token, ls);
}